

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

void __thiscall wasm::Literal::Literal(Literal *this,Name func,HeapType type)

{
  bool bVar1;
  Literal *this_local;
  HeapType type_local;
  Name func_local;
  
  type_local.id = func.super_IString.str._M_len;
  (this->field_0).i64 = type_local.id;
  (this->field_0).func.super_IString.str._M_str = func.super_IString.str._M_str;
  this_local = (Literal *)type.id;
  Type::Type(&this->type,type,NonNullable,Inexact);
  bVar1 = HeapType::isSignature((HeapType *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isSignature()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                  ,0x5c,"wasm::Literal::Literal(Name, HeapType)");
  }
  return;
}

Assistant:

explicit Literal(Name func, HeapType type)
    : func(func), type(type, NonNullable) {
    assert(type.isSignature());
  }